

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_truncated_cone_dist(REF_DBL *cone_geom,REF_DBL *p,REF_DBL *dist)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_DBL local_218;
  double local_210;
  double local_200;
  double local_1f8;
  double local_1e8;
  double local_1e0;
  REF_DBL local_1d0;
  double local_1c8;
  double local_1b8;
  double local_1a8;
  double local_1a0;
  double local_190;
  double local_188;
  double local_178;
  REF_DBL local_170;
  REF_DBL local_168;
  REF_DBL local_160;
  REF_DBL local_158;
  double local_150;
  double local_140;
  REF_STATUS ref_private_macro_code_rsb;
  REF_DBL r;
  REF_BOOL verbose;
  REF_DBL yprime;
  REF_DBL xprime;
  REF_DBL s;
  REF_DBL delta;
  REF_DBL rb;
  REF_DBL ra;
  REF_DBL n;
  REF_DBL y2;
  REF_DBL y;
  REF_DBL x;
  REF_DBL l;
  REF_DBL pa [3];
  double local_a8;
  REF_DBL u [3];
  double local_88;
  REF_DBL ba [3];
  double local_68;
  REF_DBL b [3];
  double local_48;
  REF_DBL a [3];
  REF_INT d;
  REF_DBL *dist_local;
  REF_DBL *p_local;
  REF_DBL *cone_geom_local;
  
  if (cone_geom[6] <= 0.0) {
    local_140 = -cone_geom[6];
  }
  else {
    local_140 = cone_geom[6];
  }
  if (cone_geom[7] <= 0.0) {
    local_150 = -cone_geom[7];
  }
  else {
    local_150 = cone_geom[7];
  }
  if (local_140 < local_150) {
    if (cone_geom[7] <= 0.0) {
      local_168 = -cone_geom[7];
    }
    else {
      local_168 = cone_geom[7];
    }
    rb = local_168;
    if (cone_geom[6] <= 0.0) {
      local_170 = -cone_geom[6];
    }
    else {
      local_170 = cone_geom[6];
    }
    delta = local_170;
    for (a[2]._4_4_ = 0; a[2]._4_4_ < 3; a[2]._4_4_ = a[2]._4_4_ + 1) {
      a[(long)a[2]._4_4_ + -1] = cone_geom[a[2]._4_4_ + 3];
      b[(long)a[2]._4_4_ + -1] = cone_geom[a[2]._4_4_];
    }
  }
  else {
    if (cone_geom[6] <= 0.0) {
      local_158 = -cone_geom[6];
    }
    else {
      local_158 = cone_geom[6];
    }
    rb = local_158;
    if (cone_geom[7] <= 0.0) {
      local_160 = -cone_geom[7];
    }
    else {
      local_160 = cone_geom[7];
    }
    delta = local_160;
    for (a[2]._4_4_ = 0; a[2]._4_4_ < 3; a[2]._4_4_ = a[2]._4_4_ + 1) {
      a[(long)a[2]._4_4_ + -1] = cone_geom[a[2]._4_4_];
      b[(long)a[2]._4_4_ + -1] = cone_geom[a[2]._4_4_ + 3];
    }
  }
  for (a[2]._4_4_ = 0; a[2]._4_4_ < 3; a[2]._4_4_ = a[2]._4_4_ + 1) {
    ba[(long)a[2]._4_4_ + -1] = b[(long)a[2]._4_4_ + -1] - a[(long)a[2]._4_4_ + -1];
    u[(long)a[2]._4_4_ + -1] = ba[(long)a[2]._4_4_ + -1];
    pa[(long)a[2]._4_4_ + -1] = p[a[2]._4_4_] - a[(long)a[2]._4_4_ + -1];
  }
  dVar2 = sqrt(ba[1] * ba[1] + local_88 * local_88 + ba[0] * ba[0]);
  if (dVar2 * 1e+20 <= 0.0) {
    local_178 = -(dVar2 * 1e+20);
  }
  else {
    local_178 = dVar2 * 1e+20;
  }
  if (local_a8 <= 0.0) {
    local_188 = -local_a8;
  }
  else {
    local_188 = local_a8;
  }
  if (local_188 < local_178) {
    if (dVar2 * 1e+20 <= 0.0) {
      local_190 = -(dVar2 * 1e+20);
    }
    else {
      local_190 = dVar2 * 1e+20;
    }
    if (u[0] <= 0.0) {
      local_1a0 = -u[0];
    }
    else {
      local_1a0 = u[0];
    }
    if (local_1a0 < local_190) {
      if (dVar2 * 1e+20 <= 0.0) {
        local_1a8 = -(dVar2 * 1e+20);
      }
      else {
        local_1a8 = dVar2 * 1e+20;
      }
      if (u[1] <= 0.0) {
        local_1b8 = -u[1];
      }
      else {
        local_1b8 = u[1];
      }
      if (local_1b8 < local_1a8) {
        uVar1 = ref_math_normalize(&local_a8);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xcc3,"ref_metric_truncated_cone_dist",(ulong)uVar1,"axis length zero");
          ref_metric_tattle_truncated_cone_dist(cone_geom,p);
          return uVar1;
        }
        dVar3 = pa[1] * u[1] + l * local_a8 + pa[0] * u[0];
        dVar4 = sqrt(pa[1] * pa[1] + l * l + pa[0] * pa[0]);
        dVar4 = dVar4 * dVar4 + -(dVar3 * dVar3);
        if (0.0 < dVar4) {
          y2 = sqrt(dVar4);
        }
        else {
          y2 = 0.0;
        }
        if (dVar3 < 0.0) {
          if (dVar4 < rb * rb) {
            *dist = -dVar3;
            return 0;
          }
          dVar2 = sqrt((y2 - rb) * (y2 - rb) + dVar3 * dVar3);
          *dist = dVar2;
          return 0;
        }
        if (dVar4 < delta * delta) {
          if (dVar2 < dVar3) {
            *dist = dVar3 - dVar2;
            return 0;
          }
          *dist = 0.0;
          return 0;
        }
        dVar4 = rb - delta;
        dVar5 = sqrt(dVar2 * dVar2 + dVar4 * dVar4);
        if (dVar5 * 1e+20 <= 0.0) {
          local_1e8 = -(dVar5 * 1e+20);
        }
        else {
          local_1e8 = dVar5 * 1e+20;
        }
        local_1f8 = dVar4;
        if (dVar4 <= 0.0) {
          local_1f8 = -dVar4;
        }
        if (local_1f8 < local_1e8) {
          if (dVar5 * 1e+20 <= 0.0) {
            local_200 = -(dVar5 * 1e+20);
          }
          else {
            local_200 = dVar5 * 1e+20;
          }
          local_210 = dVar2;
          if (dVar2 <= 0.0) {
            local_210 = -dVar2;
          }
          if (local_210 < local_200) {
            dVar6 = dVar3 * (dVar2 / dVar5) + -((y2 - rb) * (dVar4 / dVar5));
            local_218 = dVar3 * (dVar4 / dVar5) + (y2 - rb) * (dVar2 / dVar5);
            if (dVar6 <= 0.0) {
              dVar2 = sqrt((y2 - rb) * (y2 - rb) + dVar3 * dVar3);
              *dist = dVar2;
              return 0;
            }
            if (dVar5 <= dVar6) {
              dVar2 = sqrt(local_218 * local_218 + (dVar6 - dVar5) * (dVar6 - dVar5));
              *dist = dVar2;
              return 0;
            }
            if (local_218 < 0.0) {
              local_218 = 0.0;
            }
            *dist = local_218;
            return 0;
          }
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xce4,"ref_metric_truncated_cone_dist","div zero forming i and j");
        ref_metric_tattle_truncated_cone_dist(cone_geom,p);
        return 1;
      }
    }
  }
  local_1d0 = sqrt(pa[1] * pa[1] + l * l + pa[0] * pa[0]);
  if (rb <= delta) {
    local_1c8 = delta;
  }
  else {
    local_1c8 = rb;
  }
  if (0.0 <= local_1d0 - local_1c8) {
    if (rb <= delta) {
      local_1e0 = delta;
    }
    else {
      local_1e0 = rb;
    }
    local_1d0 = local_1d0 - local_1e0;
  }
  else {
    local_1d0 = 0.0;
  }
  *dist = local_1d0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_truncated_cone_dist(REF_DBL *cone_geom,
                                                  REF_DBL *p, REF_DBL *dist) {
  REF_INT d;
  REF_DBL a[3], b[3], ba[3], u[3], pa[3], l, x, y, y2, n, ra, rb, delta, s;
  REF_DBL xprime, yprime;
  REF_BOOL verbose = REF_FALSE;
  if (verbose) printf("\np %f %f %f\n", p[0], p[1], p[2]);
  if (ABS(cone_geom[6]) >= ABS(cone_geom[7])) {
    ra = ABS(cone_geom[6]);
    rb = ABS(cone_geom[7]);
    for (d = 0; d < 3; d++) {
      a[d] = cone_geom[d];
      b[d] = cone_geom[d + 3];
    }
    if (verbose) printf("forward ra %f rb %f\n", ra, rb);
  } else {
    ra = ABS(cone_geom[7]);
    rb = ABS(cone_geom[6]);
    for (d = 0; d < 3; d++) {
      a[d] = cone_geom[d + 3];
      b[d] = cone_geom[d];
    }
    if (verbose) printf("reverse ra %f rb %f\n", ra, rb);
  }
  if (verbose) printf("a %f %f %f\n", a[0], a[1], a[2]);
  if (verbose) printf("b %f %f %f\n", b[0], b[1], b[2]);
  for (d = 0; d < 3; d++) {
    ba[d] = b[d] - a[d];
    u[d] = ba[d];
    pa[d] = p[d] - a[d]; /* direction flip, error in paper? */
  }
  l = sqrt(ref_math_dot(ba, ba));
  if (!ref_math_divisible(u[0], l) || !ref_math_divisible(u[1], l) ||
      !ref_math_divisible(u[2], l)) { /* assume sphere */
    REF_DBL r;
    r = sqrt(pa[0] * pa[0] + pa[1] * pa[1] + pa[2] * pa[2]);
    *dist = MAX(0, r - MAX(ra, rb));
    return REF_SUCCESS;
  }
  RSB(ref_math_normalize(u), "axis length zero",
      { ref_metric_tattle_truncated_cone_dist(cone_geom, p); });
  x = ref_math_dot(pa, u); /* sign flip, error in paper? */
  n = sqrt(ref_math_dot(pa, pa));
  y2 = n * n - x * x;
  if (verbose) printf("n2 %f x2 %f y2 %f\n", n * n, x * x, y2);
  if (y2 <= 0) {
    y = 0;
  } else {
    y = sqrt(y2);
  }
  if (verbose) printf("x %f y %f l %f\n", x, y, l);
  if (x < 0) {
    if (y2 < ra * ra) {
      *dist = -x;
      return REF_SUCCESS;
    } else {
      *dist = sqrt((y - ra) * (y - ra) + x * x);
      return REF_SUCCESS;
    }
  }
  if (y2 < rb * rb) {
    if (x > l) {
      *dist = x - l;
      return REF_SUCCESS;
    } else {
      *dist = 0;
      return REF_SUCCESS;
    }
  }
  delta = ra - rb;
  s = sqrt(l * l + delta * delta);
  RAB(ref_math_divisible(delta, s) && ref_math_divisible(l, s),
      "div zero forming i and j",
      { ref_metric_tattle_truncated_cone_dist(cone_geom, p); });
  if (verbose) printf("l/s %f delta/s %f\n", l / s, delta / s);
  xprime = x * (l / s) - (y - ra) * (delta / s);
  yprime = x * (delta / s) + (y - ra) * (l / s);
  if (verbose) printf("xprime %f yprime %f\n", xprime, yprime);
  if (xprime <= 0) {
    *dist = sqrt((y - ra) * (y - ra) + x * x);
    return REF_SUCCESS;
  }
  if (xprime >= s) {
    *dist = sqrt(yprime * yprime + (xprime - s) * (xprime - s));
    return REF_SUCCESS;
  }
  *dist = MAX(0, yprime);
  return REF_SUCCESS;
}